

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

_Bool isip(char *domain)

{
  int iVar1;
  undefined1 local_1c [4];
  char *pcStack_18;
  in_addr addr;
  char *domain_local;
  
  pcStack_18 = domain;
  iVar1 = inet_pton(2,domain,local_1c);
  return iVar1 != 0;
}

Assistant:

static bool isip(const char *domain)
{
  struct in_addr addr;
#ifdef ENABLE_IPV6
  struct in6_addr addr6;
#endif

  if(Curl_inet_pton(AF_INET, domain, &addr)
#ifdef ENABLE_IPV6
     || Curl_inet_pton(AF_INET6, domain, &addr6)
#endif
    ) {
    /* domain name given as IP address */
    return TRUE;
  }

  return FALSE;
}